

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base_const>
          (Object_Data *this,reference_wrapper<const_chaiscript::dispatch::Proxy_Function_Base> obj,
          bool t_return_value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar3;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = &std::reference_wrapper<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  *puVar1 = &PTR__Data_003d0f90;
  puVar1[2] = obj._M_data;
  *(undefined8 *)this = 0;
  puVar2 = (undefined8 *)operator_new(0x50);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_003c7aa0;
  puVar2[2] = &dispatch::Proxy_Function_Base::typeinfo;
  puVar2[3] = &dispatch::Proxy_Function_Base::typeinfo;
  *(undefined4 *)(puVar2 + 4) = 1;
  puVar2[5] = puVar1;
  puVar2[6] = 0;
  puVar2[7] = obj._M_data;
  puVar2[8] = 0;
  *(undefined1 *)(puVar2 + 9) = 1;
  *(bool *)((long)puVar2 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined8 **)this = puVar2 + 2;
  sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::reference_wrapper<T> obj, bool t_return_value) {
        auto p = &obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), true, p, t_return_value);
      }